

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::Match<1u,1u>
          (TextbookBoyerMoore<char16_t> *this,Char *input,CharCount inputLength,
          CharCount *inputOffset,Char *pat,CharCount patLen,RegexStats *stats)

{
  code *pcVar1;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *pCVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  BOOL BVar6;
  int iVar7;
  undefined4 *puVar8;
  Type *pTVar9;
  uint uVar10;
  int iVar11;
  uint k;
  ulong uVar12;
  ulong uVar13;
  Type local_8c;
  undefined4 *puStack_88;
  int lastOcc_1;
  int *local_80;
  ulong local_78;
  CharCount *local_70;
  uint local_64;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *local_60;
  TextbookBoyerMoore<char16_t> *local_58;
  ulong local_50;
  ulong local_48;
  int local_3c;
  uint local_38;
  int lastOcc;
  
  local_58 = this;
  if (input == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    lastOcc = inputLength;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xb9,"(input != 0)","input != 0");
    if (!bVar3) goto LAB_00f19e19;
    *puVar8 = 0;
    inputLength = lastOcc;
  }
  if (inputLength < *inputOffset) {
    AssertCount = AssertCount + 1;
    lastOcc = inputLength;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xba,"(inputOffset <= inputLength)","inputOffset <= inputLength");
    if (!bVar3) {
LAB_00f19e19:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar8 = 0;
    inputLength = lastOcc;
  }
  if (patLen <= inputLength) {
    uVar10 = *inputOffset;
    uVar12 = (ulong)uVar10;
    local_48 = (ulong)(patLen - 1);
    lastOcc = inputLength - (patLen - 1);
    local_70 = inputOffset;
    puStack_88 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    if (uVar10 < (uint)lastOcc) {
      local_80 = (local_58->goodSuffix).ptr;
      local_60 = &local_58->lastOccurrence;
      local_64 = patLen - 2;
      uVar13 = (ulong)patLen;
      local_50 = (ulong)patLen;
      local_38 = local_64;
      do {
        do {
          pCVar2 = local_60;
          iVar7 = (int)uVar12;
          cVar4 = '\t';
          if (pat[local_48] != input[(uint)(iVar7 + (int)local_48)]) {
            uVar10 = (uint)(ushort)input[(uint)(iVar7 + (int)local_48)];
            if (uVar10 < 0x100) {
              BVar6 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                                (local_60,uVar10);
              uVar13 = local_50;
              if (BVar6 == 0) goto LAB_00f19cc0;
              local_3c = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                                   (pCVar2,uVar10);
              uVar13 = local_50;
LAB_00f19c49:
              if ((int)local_48 - local_3c < local_80[local_48]) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar8 = puStack_88;
                *puStack_88 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                                   ,0xeb,
                                   "((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex])"
                                   ,
                                   "(int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]"
                                  );
                if (!bVar3) goto LAB_00f19e19;
                *puVar8 = 0;
              }
              uVar10 = ((int)local_48 - local_3c) + iVar7;
              bVar3 = uVar10 < (uint)lastOcc;
              cVar4 = !bVar3;
              uVar12 = (ulong)uVar10;
            }
            else {
              bVar3 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                                (local_60,uVar10,&local_3c);
              if (bVar3) goto LAB_00f19c49;
LAB_00f19cc0:
              uVar10 = iVar7 + (int)uVar13;
              uVar12 = (ulong)uVar10;
              bVar3 = uVar10 < (uint)lastOcc;
              cVar4 = '\x01';
              if (bVar3) {
                cVar4 = '\b';
              }
            }
            local_38 = CONCAT31((int3)(local_38 >> 8),(byte)local_38 & bVar3);
          }
        } while ((cVar4 == '\0') || (cVar4 == '\b'));
        if (cVar4 != '\t') {
LAB_00f19e09:
          bVar5 = (byte)local_38;
          goto LAB_00f19df8;
        }
        uVar10 = local_64;
        if (local_48 == 0) {
          *local_70 = (CharCount)uVar12;
          bVar5 = 1;
          goto LAB_00f19df8;
        }
        do {
          pCVar2 = local_60;
          if (stats != (RegexStats *)0x0) {
            stats->numCompares = stats->numCompares + 1;
          }
          if (pat[uVar10] == input[(CharCount)uVar12 + uVar10]) {
            uVar10 = uVar10 - 1;
            if ((int)uVar10 < 0) {
              *local_70 = (CharCount)uVar12;
              local_38 = (uint)CONCAT71((int7)((ulong)local_70 >> 8),1);
              iVar7 = 1;
              bVar3 = false;
            }
            else {
              iVar7 = 0;
              bVar3 = true;
            }
          }
          else {
            k = (uint)(ushort)input[(CharCount)uVar12 + uVar10];
            if (k < 0x100) {
              local_78 = uVar12;
              BVar6 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                                (local_60,k);
              if (BVar6 == 0) {
                iVar7 = (local_58->lastOccurrence).defv;
                uVar12 = local_78;
              }
              else {
                iVar7 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                                  (pCVar2,k);
                uVar12 = local_78;
              }
            }
            else {
              bVar3 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                                (local_60,k,&local_8c);
              pTVar9 = &(local_58->lastOccurrence).defv;
              if (bVar3) {
                pTVar9 = &local_8c;
              }
              iVar7 = *pTVar9;
            }
            iVar11 = uVar10 - iVar7;
            if ((int)(uVar10 - iVar7) <= local_80[(int)uVar10]) {
              iVar11 = local_80[(int)uVar10];
            }
            iVar7 = 0xd;
            bVar3 = false;
            uVar12 = (ulong)(uint)(iVar11 + (int)uVar12);
          }
        } while (iVar7 == 0);
        if ((iVar7 != 0xd) && (!bVar3)) goto LAB_00f19e09;
        uVar13 = local_50;
      } while ((uint)uVar12 < (uint)lastOcc);
    }
  }
  bVar5 = 0;
LAB_00f19df8:
  return (bool)(bVar5 & 1);
}

Assistant:

bool TextbookBoyerMoore<C>::Match
        ( const Char *const input
        , const CharCount inputLength
        , CharCount& inputOffset
        , const Char* pat
        , const CharCount patLen
#if ENABLE_REGEX_CONFIG_OPTIONS
        , RegexStats* stats
#endif
        ) const
    {

        Assert(input != 0);
        Assert(inputOffset <= inputLength);

        if (inputLength < patLen)
            return false;

        CharCount offset = inputOffset;

        const CharCount endOffset = inputLength - (patLen - 1);
        const int32* const localGoodSuffix = goodSuffix;
        const LastOccMap* const localLastOccurrence = &lastOccurrence;

        const CharCount lastPatCharIndex = (patLen - 1);

        while (offset < endOffset)
        {
            // A separate tight loop to find the last character
            while (true)
            {
                uint inputChar = Chars<Char>::CTU(input[offset + lastPatCharIndex]);
                if (MatchPatternAt<equivClassSize, lastPatCharEquivClass>(inputChar, pat, lastPatCharIndex))
                {
                    // Found a match. Break out of this loop and go to the match pattern loop
                    break;
                }
                // Negative case is more common,
                // Write the checks so that we have a super tight loop
                int lastOcc;
                if (inputChar < localLastOccurrence->GetDirectMapSize())
                {
                    if (!localLastOccurrence->IsInDirectMap(inputChar))
                    {
                        offset += patLen;
                        if (offset >= endOffset)
                        {
                            return false;
                        }
                        continue;
                    }
                    lastOcc = localLastOccurrence->GetDirectMap(inputChar);
                }
                else if (!localLastOccurrence->GetNonDirect(inputChar, lastOcc))
                {
                    offset += patLen;
                    if (offset >= endOffset)
                    {
                        return false;
                    }
                    continue;
                }
                Assert((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]);
                offset += lastPatCharIndex - lastOcc;
                if (offset >= endOffset)
                {
                    return false;
                }
            }

            // CONSIDER: we can remove this check if we stop using TextbookBoyerMoore for one char pattern
            if (lastPatCharIndex == 0)
            {
                inputOffset = offset;
                return true;
            }

            // Match the rest of the pattern
            int32 j = lastPatCharIndex - 1;
            while (true)
            {
#if ENABLE_REGEX_CONFIG_OPTIONS
                if (stats != 0)
                    stats->numCompares++;
#endif
                uint inputChar = Chars<Char>::CTU(input[offset + j]);
                if (!MatchPatternAt<equivClassSize, equivClassSize>(inputChar, pat, j))
                {
                    const int32 e = j - localLastOccurrence->Get((Char)inputChar);
                    offset += e > localGoodSuffix[j] ? e : localGoodSuffix[j];
                    break;
                }
                if (--j < 0)
                {
                    inputOffset = offset;
                    return true;
                }
            }
        }
        return false;
    }